

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

void freersakey(RSAKey *key)

{
  freersapriv(key);
  if (key->modulus != (mp_int *)0x0) {
    mp_free(key->modulus);
    key->modulus = (mp_int *)0x0;
  }
  if (key->exponent != (mp_int *)0x0) {
    mp_free(key->exponent);
    key->exponent = (mp_int *)0x0;
  }
  if (key->comment != (char *)0x0) {
    safefree(key->comment);
    key->comment = (char *)0x0;
  }
  return;
}

Assistant:

void freersakey(RSAKey *key)
{
    freersapriv(key);
    if (key->modulus) {
        mp_free(key->modulus);
        key->modulus = NULL;
    }
    if (key->exponent) {
        mp_free(key->exponent);
        key->exponent = NULL;
    }
    if (key->comment) {
        sfree(key->comment);
        key->comment = NULL;
    }
}